

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_env_set_mapsize(MDB_env *env,mdb_size_t size)

{
  int iVar1;
  char *addr;
  pgno_t pVar2;
  
  if (env->me_map != (char *)0x0) {
    if (env->me_txn != (MDB_txn *)0x0) {
      return 0x16;
    }
    pVar2 = size;
    if (size == 0) {
      pVar2 = env->me_metas[env->me_metas[0]->mm_txnid < env->me_metas[1]->mm_txnid]->mm_mapsize;
    }
    size = (ulong)env->me_psize *
           (env->me_metas[env->me_metas[0]->mm_txnid < env->me_metas[1]->mm_txnid]->mm_last_pg + 1);
    if (size < pVar2) {
      size = pVar2;
    }
    munmap(env->me_map,env->me_mapsize);
    env->me_mapsize = size;
    if ((env->me_flags & 1) == 0) {
      addr = (char *)0x0;
    }
    else {
      addr = env->me_map;
    }
    iVar1 = mdb_env_map(env,addr);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  env->me_mapsize = size;
  if ((ulong)env->me_psize != 0) {
    env->me_maxpg = size / env->me_psize;
  }
  return 0;
}

Assistant:

int ESECT
mdb_env_set_mapsize(MDB_env *env, mdb_size_t size)
{
	/* If env is already open, caller is responsible for making
	 * sure there are no active txns.
	 */
	if (env->me_map) {
		MDB_meta *meta;
#ifndef MDB_VL32
		void *old;
		int rc;
#endif
		if (env->me_txn)
			return EINVAL;
		meta = mdb_env_pick_meta(env);
		if (!size)
			size = meta->mm_mapsize;
		{
			/* Silently round up to minimum if the size is too small */
			mdb_size_t minsize = (meta->mm_last_pg + 1) * env->me_psize;
			if (size < minsize)
				size = minsize;
		}
#ifndef MDB_VL32
		/* For MDB_VL32 this bit is a noop since we dynamically remap
		 * chunks of the DB anyway.
		 */
		munmap(env->me_map, env->me_mapsize);
		env->me_mapsize = size;
		old = (env->me_flags & MDB_FIXEDMAP) ? env->me_map : NULL;
		rc = mdb_env_map(env, old);
		if (rc)
			return rc;
#endif /* !MDB_VL32 */
	}
	env->me_mapsize = size;
	if (env->me_psize)
		env->me_maxpg = env->me_mapsize / env->me_psize;
	return MDB_SUCCESS;
}